

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transcode_utils.h
# Opt level: O1

void __thiscall
ktx::OptionsTranscodeTarget<true>::validateTextureTranscode
          (OptionsTranscodeTarget<true> *this,KTXTexture2 *texture,Reporter *report)

{
  TranscodeSwizzleInfo tswizzle;
  TranscodeSwizzleInfo local_30;
  
  determineTranscodeSwizzle(&local_30,texture,report);
  if ((this->transcodeTarget).super__Optional_base<ktx_transcode_fmt_e,_true,_true>._M_payload.
      super__Optional_payload_base<ktx_transcode_fmt_e>._M_engaged == false) {
    (this->transcodeTarget).super__Optional_base<ktx_transcode_fmt_e,_true,_true>._M_payload.
    super__Optional_payload_base<ktx_transcode_fmt_e> =
         (_Optional_payload_base<ktx_transcode_fmt_e>)0x10000000d;
    std::__cxx11::string::_M_replace
              ((ulong)&this->transcodeTargetName,0,
               (char *)(this->transcodeTargetName)._M_string_length,0x20f317);
    this->transcodeSwizzleComponents = local_30.defaultNumComponents;
  }
  std::__cxx11::string::_M_assign((string *)&this->transcodeSwizzle);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30.swizzle._M_dataplus._M_p != &local_30.swizzle.field_2) {
    operator_delete(local_30.swizzle._M_dataplus._M_p,
                    local_30.swizzle.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void validateTextureTranscode(const KTXTexture2& texture, Reporter& report) {
        const auto tswizzle = determineTranscodeSwizzle(texture, report);

        if (!transcodeTarget.has_value()) {
            transcodeTarget = KTX_TTF_RGBA32;
            transcodeTargetName = "rgba8";
            transcodeSwizzleComponents = tswizzle.defaultNumComponents;
        }

        transcodeSwizzle = tswizzle.swizzle;
    }